

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O0

int32_t __thiscall
charls::context_run_mode::compute_error_value(context_run_mode *this,int32_t temp,int32_t k)

{
  bool bVar1;
  bool bVar2;
  bool local_29;
  int32_t error_value_abs;
  bool map;
  int32_t k_local;
  int32_t temp_local;
  context_run_mode *this_local;
  
  bVar2 = (temp & 1U) != 0;
  this_local._4_4_ = (int)(temp + (uint)bVar2) / 2;
  local_29 = true;
  if (k == 0) {
    local_29 = (uint)this->n_ <= (uint)this->nn_ * 2;
  }
  if (local_29 == bVar2) {
    bVar1 = compute_map(this,-this_local._4_4_,k);
    if (bVar2 != bVar1) {
      __assert_fail("map == compute_map(-error_value_abs, k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                    ,0x4b,
                    "int32_t charls::context_run_mode::compute_error_value(const int32_t, const int32_t) const"
                   );
    }
    this_local._4_4_ = -this_local._4_4_;
  }
  else {
    bVar1 = compute_map(this,this_local._4_4_,k);
    if (bVar2 != bVar1) {
      __assert_fail("map == compute_map(error_value_abs, k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                    ,0x4f,
                    "int32_t charls::context_run_mode::compute_error_value(const int32_t, const int32_t) const"
                   );
    }
  }
  return this_local._4_4_;
}

Assistant:

FORCE_INLINE int32_t compute_error_value(const int32_t temp, const int32_t k) const noexcept
    {
        const bool map = temp & 1;
        const int32_t error_value_abs{(temp + static_cast<int32_t>(map)) / 2};

        if ((k != 0 || (2 * nn_ >= n_)) == map)
        {
            ASSERT(map == compute_map(-error_value_abs, k));
            return -error_value_abs;
        }

        ASSERT(map == compute_map(error_value_abs, k));
        return error_value_abs;
    }